

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

value_type * __thiscall
poplar::
map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>::
find(map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
     *this,char_range key)

{
  bool bVar1;
  undefined8 uVar2;
  uint64_t uVar3;
  type *ptVar4;
  const_reference pvVar5;
  uint8_t *in_RDX;
  uint8_t *in_RSI;
  byte *in_RDI;
  pair<const_int_*,_unsigned_long> pVar6;
  type *match;
  type *vptr;
  uint64_t node_id;
  undefined7 in_stack_ffffffffffffff48;
  uint8_t in_stack_ffffffffffffff4f;
  map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
  *in_stack_ffffffffffffff50;
  uint64_t in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff78 [16];
  char_range *in_stack_ffffffffffffff90;
  pair<const_int_*,_unsigned_long> in_stack_ffffffffffffff98;
  char_range local_18;
  
  local_18.begin = in_RSI;
  local_18.end = in_RDX;
  bVar1 = char_range::empty(&local_18);
  if (bVar1) {
    uVar2 = __cxa_allocate_exception(0x10);
    exception::exception
              ((exception *)in_stack_ffffffffffffff50,
               (char *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    __cxa_throw(uVar2,&exception::typeinfo,exception::~exception);
  }
  if (local_18.end[-1] != '\0') {
    uVar2 = __cxa_allocate_exception(0x10);
    exception::exception
              ((exception *)in_stack_ffffffffffffff50,
               (char *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    __cxa_throw(uVar2,&exception::typeinfo,exception::~exception);
  }
  if (((*in_RDI & 1) == 0) ||
     (uVar3 = plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::size
                        ((plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *)(in_RDI + 0x10)),
     uVar3 == 0)) {
    return (value_type *)0x0;
  }
  plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::get_root
            ((plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *)(in_RDI + 0x10));
  while( true ) {
    bVar1 = char_range::empty(&local_18);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      pVar6 = plain_bonsai_nlm<int>::compare
                        ((plain_bonsai_nlm<int> *)in_stack_ffffffffffffff98.second,
                         (uint64_t)in_stack_ffffffffffffff98.first,in_stack_ffffffffffffff90);
      return pVar6.first;
    }
    in_stack_ffffffffffffff98 =
         plain_bonsai_nlm<int>::compare
                   ((plain_bonsai_nlm<int> *)in_stack_ffffffffffffff98.second,
                    (uint64_t)in_stack_ffffffffffffff98.first,in_stack_ffffffffffffff90);
    in_stack_ffffffffffffff90 =
         (char_range *)
         std::get<0ul,int_const*,unsigned_long>((pair<const_int_*,_unsigned_long> *)0x1148ae);
    ptVar4 = std::get<1ul,int_const*,unsigned_long>((pair<const_int_*,_unsigned_long> *)0x1148bd);
    if ((type)in_stack_ffffffffffffff90->begin != (type)0x0) {
      return (value_type *)in_stack_ffffffffffffff90->begin;
    }
    local_18.begin = local_18.begin + *ptVar4;
    while (*(ulong *)(in_RDI + 8) <= *ptVar4) {
      uVar3 = plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::find_child
                        (in_stack_ffffffffffffff78._0_8_,(uint64_t)in_RDI,in_stack_ffffffffffffff68)
      ;
      if (uVar3 == 0xffffffffffffffff) {
        return (value_type *)0x0;
      }
      *ptVar4 = *ptVar4 - *(long *)(in_RDI + 8);
    }
    pvVar5 = std::array<unsigned_char,_256UL>::operator[]
                       ((array<unsigned_char,_256UL> *)in_stack_ffffffffffffff50,
                        CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    if (*pvVar5 == 0xff) break;
    in_stack_ffffffffffffff50 =
         (map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
          *)(in_RDI + 0x10);
    make_symb_(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4f,0x1149ca);
    uVar3 = plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::find_child
                      (in_stack_ffffffffffffff78._0_8_,(uint64_t)in_RDI,in_stack_ffffffffffffff68);
    if (uVar3 == 0xffffffffffffffff) {
      return (value_type *)0x0;
    }
    local_18.begin = local_18.begin + 1;
  }
  return (value_type *)0x0;
}

Assistant:

const value_type* find(char_range key) const {
        POPLAR_THROW_IF(key.empty(), "key must be a non-empty string.");
        POPLAR_THROW_IF(*(key.end - 1) != '\0', "The last character of key must be the null terminator.");

        if (!is_ready_ or hash_trie_.size() == 0) {
            return nullptr;
        }

        auto node_id = hash_trie_.get_root();

        while (!key.empty()) {
            auto [vptr, match] = label_store_.compare(node_id, key);
            if (vptr != nullptr) {
                return vptr;
            }

            key.begin += match;

            while (lambda_ <= match) {
                node_id = hash_trie_.find_child(node_id, step_symb);
                if (node_id == nil_id) {
                    return nullptr;
                }
                match -= lambda_;
            }

            if (codes_[*key.begin] == UINT8_MAX) {
                // Detecting an useless character
                return nullptr;
            }

            node_id = hash_trie_.find_child(node_id, make_symb_(*key.begin, match));
            if (node_id == nil_id) {
                return nullptr;
            }

            ++key.begin;
        }

        return label_store_.compare(node_id, key).first;
    }